

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::AggressiveDCEPass::KillDeadInstructions
          (AggressiveDCEPass *this,Function *func,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *structured_order)

{
  BasicBlock *this_00;
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  reference ppBVar4;
  DefUseManager *pDVar5;
  Instruction *pIVar6;
  Operand *local_160;
  Instruction *inst;
  iterator local_128;
  undefined8 local_120;
  SmallVector<unsigned_int,_2UL> local_118;
  Operand local_f0;
  iterator local_c0;
  _func_int **local_b8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_b0;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_98;
  Instruction *undef;
  Instruction *pIStack_88;
  uint32_t undef_id;
  Instruction *func_ret_type_inst;
  Instruction *merge_terminator;
  bool *local_70;
  uint32_t *local_68;
  function<void_(spvtools::opt::Instruction_*)> local_60;
  uint32_t local_3c;
  iterator iStack_38;
  uint32_t merge_block_id;
  _Self local_30;
  iterator bi;
  bool modified;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *structured_order_local;
  Function *func_local;
  AggressiveDCEPass *this_local;
  
  bi._M_node._7_1_ = 0;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
       ::begin(structured_order);
  while( true ) {
    iStack_38 = std::__cxx11::
                list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::end
                          (structured_order);
    bVar1 = std::operator!=(&local_30,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    local_3c = 0;
    ppBVar4 = std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&local_30);
    this_00 = *ppBVar4;
    local_70 = (bool *)((long)&bi._M_node + 7);
    local_68 = &local_3c;
    merge_terminator = (Instruction *)this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::AggressiveDCEPass::KillDeadInstructions(spvtools::opt::Function_const*,std::__cxx11::list<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>&)::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_60,
               (anon_class_24_3_110849d0 *)&merge_terminator);
    BasicBlock::ForEachInst(this_00,&local_60,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_60);
    uVar2 = local_3c;
    if (local_3c == 0) {
      ppBVar4 = std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&local_30);
      pIVar6 = BasicBlock::terminator(*ppBVar4);
      bVar1 = IsLive(this,pIVar6);
      if (!bVar1) {
        ppBVar4 = std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&local_30);
        AddUnreachable(this,ppBVar4);
      }
      std::_List_iterator<spvtools::opt::BasicBlock_*>::operator++(&local_30);
    }
    else {
      ppBVar4 = std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&local_30);
      AddBranch(this,uVar2,*ppBVar4);
      std::_List_iterator<spvtools::opt::BasicBlock_*>::operator++(&local_30);
      while( true ) {
        ppBVar4 = std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&local_30);
        uVar2 = BasicBlock::id(*ppBVar4);
        if (uVar2 == local_3c) break;
        std::_List_iterator<spvtools::opt::BasicBlock_*>::operator++(&local_30);
      }
      ppBVar4 = std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&local_30);
      func_ret_type_inst = BasicBlock::terminator(*ppBVar4);
      OVar3 = opt::Instruction::opcode(func_ret_type_inst);
      if (OVar3 == OpUnreachable) {
        pDVar5 = Pass::get_def_use_mgr((Pass *)this);
        uVar2 = opt::Function::type_id(func);
        pIStack_88 = analysis::DefUseManager::GetDef(pDVar5,uVar2);
        OVar3 = opt::Instruction::opcode(pIStack_88);
        if (OVar3 == OpTypeVoid) {
          opt::Instruction::SetOpcode(func_ret_type_inst,OpReturn);
        }
        else {
          uVar2 = opt::Function::type_id(func);
          undef._4_4_ = MemPass::Type2Undef(&this->super_MemPass,uVar2);
          pDVar5 = Pass::get_def_use_mgr((Pass *)this);
          local_98._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )analysis::DefUseManager::GetDef(pDVar5,undef._4_4_);
          uVar2 = opt::Instruction::unique_id
                            ((Instruction *)
                             local_98._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl);
          utils::BitVector::Set(&this->live_insts_,uVar2);
          opt::Instruction::SetOpcode(func_ret_type_inst,OpReturnValue);
          pIVar6 = func_ret_type_inst;
          inst._4_4_ = undef._4_4_;
          local_128 = (iterator)((long)&inst + 4);
          local_120 = 1;
          init_list._M_len = 1;
          init_list._M_array = local_128;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_118,init_list);
          Operand::Operand(&local_f0,SPV_OPERAND_TYPE_ID,&local_118);
          local_c0 = &local_f0;
          local_b8 = (_func_int **)0x1;
          std::allocator<spvtools::opt::Operand>::allocator
                    ((allocator<spvtools::opt::Operand> *)((long)&inst + 3));
          __l._M_len = (size_type)local_b8;
          __l._M_array = local_c0;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                    (&local_b0,__l,(allocator_type *)((long)&inst + 3));
          opt::Instruction::SetInOperands(pIVar6,&local_b0);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_b0);
          std::allocator<spvtools::opt::Operand>::~allocator
                    ((allocator<spvtools::opt::Operand> *)((long)&inst + 3));
          local_160 = (Operand *)&local_c0;
          do {
            local_160 = local_160 + -1;
            Operand::~Operand(local_160);
          } while (local_160 != &local_f0);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_118);
          pDVar5 = Pass::get_def_use_mgr((Pass *)this);
          analysis::DefUseManager::AnalyzeInstUse(pDVar5,func_ret_type_inst);
        }
        uVar2 = opt::Instruction::unique_id(func_ret_type_inst);
        utils::BitVector::Set(&this->live_insts_,uVar2);
      }
    }
  }
  return (bool)(bi._M_node._7_1_ & 1);
}

Assistant:

bool AggressiveDCEPass::KillDeadInstructions(
    const Function* func, std::list<BasicBlock*>& structured_order) {
  bool modified = false;
  for (auto bi = structured_order.begin(); bi != structured_order.end();) {
    uint32_t merge_block_id = 0;
    (*bi)->ForEachInst([this, &modified, &merge_block_id](Instruction* inst) {
      if (IsLive(inst)) return;
      if (inst->opcode() == spv::Op::OpLabel) return;
      // If dead instruction is selection merge, remember merge block
      // for new branch at end of block
      if (inst->opcode() == spv::Op::OpSelectionMerge ||
          inst->opcode() == spv::Op::OpLoopMerge)
        merge_block_id = inst->GetSingleWordInOperand(0);
      to_kill_.push_back(inst);
      modified = true;
    });
    // If a structured if or loop was deleted, add a branch to its merge
    // block, and traverse to the merge block and continue processing there.
    // We know the block still exists because the label is not deleted.
    if (merge_block_id != 0) {
      AddBranch(merge_block_id, *bi);
      for (++bi; (*bi)->id() != merge_block_id; ++bi) {
      }

      auto merge_terminator = (*bi)->terminator();
      if (merge_terminator->opcode() == spv::Op::OpUnreachable) {
        // The merge was unreachable. This is undefined behaviour so just
        // return (or return an undef). Then mark the new return as live.
        auto func_ret_type_inst = get_def_use_mgr()->GetDef(func->type_id());
        if (func_ret_type_inst->opcode() == spv::Op::OpTypeVoid) {
          merge_terminator->SetOpcode(spv::Op::OpReturn);
        } else {
          // Find an undef for the return value and make sure it gets kept by
          // the pass.
          auto undef_id = Type2Undef(func->type_id());
          auto undef = get_def_use_mgr()->GetDef(undef_id);
          live_insts_.Set(undef->unique_id());
          merge_terminator->SetOpcode(spv::Op::OpReturnValue);
          merge_terminator->SetInOperands({{SPV_OPERAND_TYPE_ID, {undef_id}}});
          get_def_use_mgr()->AnalyzeInstUse(merge_terminator);
        }
        live_insts_.Set(merge_terminator->unique_id());
      }
    } else {
      Instruction* inst = (*bi)->terminator();
      if (!IsLive(inst)) {
        // If the terminator is not live, this block has no live instructions,
        // and it will be unreachable.
        AddUnreachable(*bi);
      }
      ++bi;
    }
  }
  return modified;
}